

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::InnerProduct3D_1D::backward_impl
          (InnerProduct3D_1D *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Tensor *pTVar4;
  float *pfVar5;
  Assign assign;
  Assign assign_1;
  DefaultDevice local_a9;
  type local_a8;
  undefined1 local_98 [16];
  type *ptStack_88;
  long local_80;
  type local_78;
  undefined8 uStack_20;
  undefined8 uStack_18;
  
  if ((dEdf->d).nd != 2) {
    __assert_fail("d.ndims() == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                  ,0xb8,"const Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t() const");
  }
  local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] = (long)dEdf->v;
  local_78.m_rhs_xpr.m_lhs_xpr.m_data = (StoragePointerType)(long)(int)(dEdf->d).d[0];
  local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
       (long)(int)(dEdf->d).d[1];
  if (i == 2) {
    if ((dEdxi->d).nd != 2) {
      __assert_fail("d.ndims() == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xb4,"Eigen::TensorMap<Eigen::Tensor<float, 2>> cnn::Tensor::t()");
    }
    local_98._0_8_ = dEdxi->v;
    local_a8.m_data = (StoragePointerType)local_98;
    local_a8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_78;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(ulong *)(dEdxi->d).d;
    unique0x000fe280 = vpmovsxdq_avx(auVar3);
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = (long)ptStack_88;
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = local_98._8_8_;
    local_78.m_lhs_xpr.m_data = (StoragePointerType)local_98._0_8_;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
           *)&local_a8,&local_a9);
  }
  else if (i == 1) {
    pTVar4 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((pTVar4->d).nd != 3) {
      __assert_fail("d.ndims() == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xc0,"const Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t() const");
    }
    if ((dEdxi->d).nd != 1) {
      __assert_fail("d.ndims() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xac,"Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t()");
    }
    local_a8.m_data = dEdxi->v;
    local_a8.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(dEdxi->d).d[0];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)(pTVar4->d).d;
    local_78.m_rhs_xpr._16_16_ = vpmovsxdq_avx(auVar2);
    local_98._0_8_ = &local_a8;
    local_78.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(pTVar4->d).d[2];
    local_78.m_rhs_xpr._40_8_ = 0;
    local_78._80_8_ = 0;
    uStack_20 = 1;
    uStack_18 = 1;
    ptStack_88 = (type *)local_98._8_8_;
    local_98._8_8_ = &local_78;
    local_78.m_lhs_xpr.m_data = local_a8.m_data;
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
         (long)local_a8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2];
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
         (long)local_78.m_rhs_xpr.m_lhs_xpr.m_data;
    local_78.m_rhs_xpr.m_lhs_xpr.m_data =
         (StoragePointerType)
         local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)pTVar4->v;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
           *)local_98,&local_a9);
  }
  else {
    if (i != 0) {
      std::operator<<((ostream *)&std::cerr,"shouldn\'t happen\n");
      abort();
    }
    pTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[1];
    if ((pTVar4->d).nd != 1) {
      __assert_fail("d.ndims() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xb0,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> cnn::Tensor::t() const");
    }
    if ((dEdxi->d).nd != 3) {
      __assert_fail("d.ndims() == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0xbc,"Eigen::TensorMap<Eigen::Tensor<float, 3>> cnn::Tensor::t()");
    }
    local_98._0_8_ = dEdxi->v;
    local_a8.m_data = (StoragePointerType)local_98;
    local_78.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(long)(int)(pTVar4->d).d[0];
    local_80 = (long)(int)(dEdxi->d).d[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(dEdxi->d).d;
    unique0x000fe280 = vpmovsxdq_avx(auVar1);
    local_a8.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_78;
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = local_98._8_8_;
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = (long)ptStack_88;
    local_78.m_rhs_xpr.m_rhs_xpr.m_data = pTVar4->v;
    local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_78.m_lhs_xpr.m_data = (StoragePointerType)local_98._0_8_;
    pfVar5 = (float *)local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2];
    local_78.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] = local_80;
    local_78.m_rhs_xpr.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         (long)local_78.m_rhs_xpr.m_lhs_xpr.m_data;
    local_78.m_rhs_xpr.m_lhs_xpr.m_data = pfVar5;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorContractionOp<const_std::array<Eigen::IndexPair<long>,_0UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::NoOpOutputKernel>_>_>
           *)&local_a8,&local_a9);
  }
  return;
}

Assistant:

void InnerProduct3D_1D::backward_impl(const vector<const Tensor*>& xs,
                     const Tensor& fx,
                     const Tensor& dEdf,
                     unsigned i,
                     Tensor& dEdxi) const {
  auto tdEdf = dEdf.t<2>();  // 2 tensor
  typedef Eigen::Tensor<float, 1>::DimensionPair DimPair;
  if (i == 0) { // 3 tensor
    // tensor product
    auto b = xs[1]->t<1>();
    dEdxi.t<3>() += tdEdf.contract(b, Eigen::array<DimPair, 0>{{}});
  } else if (i == 1) {
    auto A = xs[0]->t<3>();  // A is 3 tensor
    Eigen::array<DimPair, 2> dims({{DimPair(0, 0), DimPair(1, 1)}});
    dEdxi.t<1>() += tdEdf.contract(A, dims);
  } else if (i == 2) {
    dEdxi.t<2>() += tdEdf;
  } else {
    cerr << "shouldn't happen\n"; abort();
  }
}